

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_query.c
# Opt level: O3

void ares_query(ares_channel_t *channel,char *name,int dnsclass,int type,ares_callback callback,
               void *arg)

{
  ares_status_t status;
  void *arg_00;
  size_t max_udp_size;
  undefined8 *arg_01;
  ares_dns_record_t *local_38;
  
  if (channel == (ares_channel_t *)0x0) {
    return;
  }
  arg_00 = ares_dnsrec_convert_arg(callback,arg);
  if (arg_00 == (void *)0x0) {
    (*callback)(arg,0xf,0,(uchar *)0x0,0);
    return;
  }
  ares_channel_lock(channel);
  local_38 = (ares_dns_record_t *)0x0;
  if (name == (char *)0x0) {
    status = ARES_EFORMERR;
  }
  else {
    if ((channel->flags >> 8 & 1) == 0) {
      max_udp_size = 0;
    }
    else {
      max_udp_size = channel->ednspsz;
    }
    status = ares_dns_record_create_query
                       (&local_38,name,dnsclass,type,0,~channel->flags & ARES_FLAG_RD,max_udp_size);
    if (status == ARES_SUCCESS) {
      arg_01 = (undefined8 *)ares_malloc(0x10);
      if (arg_01 == (undefined8 *)0x0) {
        ares_dnsrec_convert_cb(arg_00,ARES_ENOMEM,0,(ares_dns_record_t *)0x0);
      }
      else {
        *arg_01 = ares_dnsrec_convert_cb;
        arg_01[1] = arg_00;
        ares_send_nolock(channel,(ares_server_t *)0x0,0,local_38,ares_query_dnsrec_cb,arg_01,
                         (unsigned_short *)0x0);
      }
      ares_dns_record_destroy(local_38);
      goto LAB_001151be;
    }
  }
  ares_dnsrec_convert_cb(arg_00,status,0,(ares_dns_record_t *)0x0);
LAB_001151be:
  ares_channel_unlock(channel);
  return;
}

Assistant:

void ares_query(ares_channel_t *channel, const char *name, int dnsclass,
                int type, ares_callback callback, void *arg)
{
  void *carg = NULL;

  if (channel == NULL) {
    return;
  }

  carg = ares_dnsrec_convert_arg(callback, arg);
  if (carg == NULL) {
    callback(arg, ARES_ENOMEM, 0, NULL, 0); /* LCOV_EXCL_LINE: OutOfMemory */
    return;                                 /* LCOV_EXCL_LINE: OutOfMemory */
  }

  ares_query_dnsrec(channel, name, (ares_dns_class_t)dnsclass,
                    (ares_dns_rec_type_t)type, ares_dnsrec_convert_cb, carg,
                    NULL);
}